

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void setCmdOptionsAndRun(Carver *carver,int argc,char **argv)

{
  int iVar1;
  _Alloc_hider __nptr;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  size_t sVar5;
  char *__s;
  int *piVar6;
  CarveMode carveMode;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  float carveAmount;
  float fVar11;
  string filename;
  string carveModeStr;
  string outputStr;
  string local_218;
  char **local_1f8;
  string local_1f0;
  Carver *local_1d0;
  char **local_1c8;
  string local_1c0;
  int local_19c;
  pointer local_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110 [2];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar7 = &local_1f0.field_2;
  local_1f0._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"-h","");
  local_1f8 = argv + argc;
  ppcVar3 = std::__find_if<char**,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (argv,local_1f8,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (ppcVar3 != local_1f8) {
    usage();
    exit(0);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"-m","");
  pcVar4 = getCmdOption(argv,local_1f8,&local_1f0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (pcVar4 == (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Carve mode value missing","");
    terminate(1,&local_50);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar7;
  sVar5 = strlen(pcVar4);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,pcVar4,pcVar4 + sVar5);
  iVar2 = std::__cxx11::string::compare((char *)&local_1f0);
  if (iVar2 == 0) {
    carveMode = BOTH;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_1f0);
    if (iVar2 == 0) {
      carveMode = VERTICAL;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_1f0);
      carveMode = HORIZONTAL;
      if (iVar2 != 0) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Carve mode value invalid","");
        terminate(1,&local_70);
      }
    }
  }
  ::carver::Carver::setCarveMode(carver,carveMode);
  paVar7 = &local_1c0.field_2;
  local_1c0._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"-o","");
  pcVar4 = getCmdOption(argv,local_1f8,&local_1c0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if (pcVar4 == (char *)0x0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Output path missing","");
    terminate(1,&local_90);
  }
  local_1c0._M_dataplus._M_p = (pointer)paVar7;
  sVar5 = strlen(pcVar4);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,pcVar4,pcVar4 + sVar5);
  paVar7 = &local_218.field_2;
  local_218._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-c","");
  pcVar4 = getCmdOption(argv,local_1f8,&local_218,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar7) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_19c = argc;
  if (pcVar4 == (char *)0x0) {
    iVar8 = 4;
    iVar2 = 0;
  }
  else {
    iVar2 = atoi(pcVar4);
    if (iVar2 == 0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Invalid argument for carve count","");
      terminate(1,&local_b0);
    }
    iVar8 = 6;
  }
  local_218._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-p","");
  local_1c8 = argv;
  __s = getCmdOption(argv,local_1f8,&local_218,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar7) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  fVar11 = 0.0;
  if (__s == (char *)0x0) {
    fVar11 = 0.15;
  }
  carveAmount = 0.0;
  if (iVar2 == 0) {
    carveAmount = fVar11;
  }
  local_1d0 = carver;
  if (__s == (char *)0x0) {
LAB_0010b79b:
    ppcVar3 = local_1c8;
    paVar7 = &local_218.field_2;
    ::carver::Carver::setCarveAmount(carver,carveAmount);
    ::carver::Carver::setCarveCount(carver,iVar2);
    local_218._M_dataplus._M_p = (pointer)paVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-v","");
    ppcVar3 = std::__find_if<char**,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (ppcVar3,local_1f8,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar7) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    bVar10 = ppcVar3 != local_1f8;
    ::carver::Carver::setVerbosity(carver,bVar10);
    uVar9 = iVar8 + (uint)bVar10;
    if (local_19c < (int)(uVar9 + 2)) {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"input path not provided","");
      terminate(1,&local_130);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_1c8[(ulong)uVar9 + 1],(allocator<char> *)&local_198);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,local_218._M_dataplus._M_p,
               local_218._M_dataplus._M_p + local_218._M_string_length);
    bVar10 = ::carver::Carver::loadTargetImage(local_1d0,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if (!bVar10) {
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,
                 "Image loading failed, please provide path as the last argument","");
      terminate(1,&local_150);
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_1c0._M_dataplus._M_p,
               local_1c0._M_dataplus._M_p + local_1c0._M_string_length);
    ::carver::Carver::carveImage(local_1d0,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar7) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  local_218._M_dataplus._M_p = (pointer)paVar7;
  sVar5 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,__s,__s + sVar5);
  __nptr._M_p = local_218._M_dataplus._M_p;
  piVar6 = __errno_location();
  iVar1 = *piVar6;
  *piVar6 = 0;
  carveAmount = strtof(__nptr._M_p,&local_198);
  carver = local_1d0;
  if (local_198 == __nptr._M_p) {
    std::__throw_invalid_argument("stof");
  }
  else {
    if (*piVar6 == 0) {
      *piVar6 = iVar1;
    }
    else if (*piVar6 == 0x22) {
      carveAmount = (float)std::__throw_out_of_range("stof");
      carver = local_1d0;
      goto LAB_0010b79b;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((carveAmount != 0.0) || (NAN(carveAmount))) {
      if (pcVar4 != (char *)0x0) {
        local_110[0]._M_dataplus._M_p = (pointer)&local_110[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_110,"Invalid combination of arguments -p and -c","");
        terminate(1,local_110);
      }
      iVar8 = iVar8 + 2;
      goto LAB_0010b79b;
    }
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"Invalid argument for carve amount","");
  terminate(1,&local_d0);
}

Assistant:

void setCmdOptionsAndRun(carver::Carver &carver, int argc, char *argv[]) {

    int optionCount = 0;

    // Request for help
    if (cmdOptionExists(argv, argv+argc, "-h")) {
            usage();
            exit(0);
    }

    // Carve mode
    carver::CarveMode carveMode;
    char* carveModeOpt = getCmdOption(argv, argv+argc, "-m", true);
    if (!carveModeOpt)
        terminate(1, "Carve mode value missing");
    string carveModeStr(carveModeOpt);
    optionCount+=2;
    if (carveModeStr == "both")
        carveMode = carver::BOTH;
    else if (carveModeStr == "vertical")
        carveMode = carver::VERTICAL;
    else if (carveModeStr == "horizontal")
        carveMode = carver::HORIZONTAL;
    else
        terminate(1, "Carve mode value invalid");

    carver.setCarveMode(carveMode);

    // Output path
    char* outputOpt = getCmdOption(argv, argv+argc, "-o", true);
    if (!outputOpt)
        terminate(1, "Output path missing");
    string outputStr(outputOpt);
    optionCount+=2;

    // Carve amount, absolute count
    int carveCount = 0;
    char* carveCountOpt = getCmdOption(argv, argv+argc, "-c", false);
    if (carveCountOpt) {
        carveCount = atoi(carveCountOpt);
        optionCount+=2;
        if (carveCount == 0) {
            terminate(1, "Invalid argument for carve count");
        }
    }

    // Carve amount, proportional
    float carveAmount = 0.0f;
    char* carveAmountOpt = getCmdOption(argv, argv+argc, "-p", false);
    if (!carveAmountOpt && !carveCount) {
        carveAmount = 0.15f;
    } else if (carveAmountOpt) {
        try {
            carveAmount = stof(string(carveAmountOpt));
            optionCount+=2;
            if (carveAmount == 0.0f) {
                terminate(1, "Invalid argument for carve amount");
            }
        } catch (invalid_argument&) {
            terminate(1, "Invalid argument for carve amount");
        }
    }

    if (carveAmountOpt && carveCountOpt)
        terminate(1, "Invalid combination of arguments -p and -c");

    carver.setCarveAmount(carveAmount);
    carver.setCarveCount(carveCount);


    // Verbosity
    bool verbose = false;
    if(cmdOptionExists(argv, argv+argc, "-v")) {
        verbose = true;
        optionCount++;
    }
    carver.setVerbosity(verbose);

    // Load target image
    if (argc < optionCount + 2)
        terminate(1, "input path not provided");
    string filename = argv[optionCount + 1];

    if(!carver.loadTargetImage(filename)) {
        terminate(1, "Image loading failed, please provide path as the last argument");
    }

    carver.carveImage(outputStr);
}